

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_store_fpr_F(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v)

{
  TCGContext_conflict8 *tcg_ctx_00;
  uint ofs;
  TCGv_i32 t;
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 v_local;
  uint dst_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  ofs = 0x20;
  if ((dst & 1) != 0) {
    ofs = 0;
  }
  tcg_gen_deposit_i64_sparc64
            (tcg_ctx_00,tcg_ctx_00->cpu_fpr[dst >> 1],tcg_ctx_00->cpu_fpr[dst >> 1],(TCGv_i64)v,ofs,
             0x20);
  gen_update_fprs_dirty(dc,dst);
  return;
}

Assistant:

static void gen_store_fpr_F(DisasContext *dc, unsigned int dst, TCGv_i32 v)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
#if TCG_TARGET_REG_BITS == 32
    if (dst & 1) {
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2]), v);
    } else {
        tcg_gen_mov_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2]), v);
    }
#else
    TCGv_i64 t = (TCGv_i64)v;
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], tcg_ctx->cpu_fpr[dst / 2], t,
                        (dst & 1 ? 0 : 32), 32);
#endif
    gen_update_fprs_dirty(dc, dst);
}